

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int64_t r_code::Utils::GetGroupResilience
                  (double resilience,double origin_upr,double destination_upr)

{
  double dVar1;
  double res;
  double r;
  double destination_upr_local;
  double origin_upr_local;
  double resilience_local;
  
  if ((origin_upr != 0.0) || (NAN(origin_upr))) {
    if (origin_upr < destination_upr) {
      dVar1 = resilience * (origin_upr / destination_upr);
      if (1.0 <= dVar1) {
        resilience_local = (double)(long)dVar1;
      }
      else {
        resilience_local = 4.94065645841247e-324;
      }
    }
    else {
      resilience_local = 4.94065645841247e-324;
    }
  }
  else {
    resilience_local = 4.94065645841247e-324;
  }
  return (int64_t)resilience_local;
}

Assistant:

int64_t Utils::GetGroupResilience(double resilience, double origin_upr, double destination_upr)
{
    if (origin_upr == 0) {
        return 1;
    }

    if (destination_upr <= origin_upr) {
        return 1;
    }

    double r = origin_upr / destination_upr;
    double res = resilience * r;

    if (res < 1) {
        return 1;
    }

    return res;
}